

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void sparc_tr_translate_insn(DisasContextBase *dcbase,CPUState *cs)

{
  uc_struct *uc_00;
  TCGContext_conflict8 *tcg_ctx_00;
  CPUArchState_conflict17 *env_00;
  _Bool _Var1;
  int iVar2;
  uint32_t insn_00;
  uint insn;
  CPUSPARCState_conflict2 *env;
  TCGContext_conflict8 *tcg_ctx;
  uc_struct_conflict9 *uc;
  DisasContextBase *__mptr;
  DisasContext_conflict8 *dc;
  CPUState *cs_local;
  DisasContextBase *dcbase_local;
  
  uc_00 = (uc_struct *)dcbase[4].pc_next;
  tcg_ctx_00 = (TCGContext_conflict8 *)uc_00->tcg_ctx;
  env_00 = (CPUArchState_conflict17 *)cs->env_ptr;
  iVar2 = uc_addr_is_exit(uc_00,(uint64_t)dcbase[1].tb);
  if (iVar2 == 0) {
    _Var1 = _hook_exists_bounded(uc_00->hook[2].head,(uint64_t)dcbase[1].tb);
    if (_Var1) {
      tcg_gen_movi_i64_sparc64(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_pc,(int64_t)dcbase[1].tb);
      gen_uc_tracecode(tcg_ctx_00,4,2,uc_00,(uint64_t)dcbase[1].tb);
      check_exit_request_sparc64(tcg_ctx_00);
    }
    insn_00 = translator_ldl(tcg_ctx_00,env_00,(abi_ptr)dcbase[1].tb);
    dcbase->pc_next = dcbase->pc_next + 4;
    disas_sparc_insn((DisasContext_conflict8 *)dcbase,insn_00);
    if ((dcbase->is_jmp != DISAS_NORETURN) && (dcbase[1].tb != (TranslationBlock *)dcbase->pc_next))
    {
      dcbase->is_jmp = DISAS_TOO_MANY;
    }
  }
  else {
    dcbase->is_jmp = DISAS_NORETURN;
  }
  return;
}

Assistant:

static void sparc_tr_translate_insn(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = dc->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPUSPARCState *env = cs->env_ptr;
    unsigned int insn;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, dc->pc)) {
#ifndef TARGET_SPARC64
        gen_helper_power_down(tcg_ctx, tcg_ctx->cpu_env);
#endif
        dcbase->is_jmp = DISAS_NORETURN;
        return;
    }

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, dc->pc)) {

        // Sync PC in advance
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, dc->pc);

        gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, uc, dc->pc);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    insn = translator_ldl(tcg_ctx, env, dc->pc);
    dc->base.pc_next += 4;
    disas_sparc_insn(dc, insn);

    if (dc->base.is_jmp == DISAS_NORETURN) {
        return;
    }
    if (dc->pc != dc->base.pc_next) {
        dc->base.is_jmp = DISAS_TOO_MANY;
    }
}